

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTCue_SetMatrixCoefficients
                   (FACTCue *pCue,uint32_t uSrcChannelCount,uint32_t uDstChannelCount,
                   float *pMatrixCoefficients)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  float *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint8_t i;
  byte local_19;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x11697d);
  do {
    if (in_ESI != 0 && in_ESI < 3) goto LAB_001169e2;
    iVar2 = SDL_ReportAssertion(&FACTCue_SetMatrixCoefficients::sdl_assert_data,
                                "FACTCue_SetMatrixCoefficients",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                ,0xa8b);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_001169e2:
  do {
    if (in_EDX != 0 && in_EDX < 9) goto LAB_00116a41;
    iVar2 = SDL_ReportAssertion(&FACTCue_SetMatrixCoefficients::sdl_assert_data_1,
                                "FACTCue_SetMatrixCoefficients",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                ,0xa8c);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_00116a41:
  *(uint *)(in_RDI + 0x60) = in_ESI;
  *(uint *)(in_RDI + 100) = in_EDX;
  SDL_memcpy(in_RDI + 0x68,in_RCX,(ulong)in_ESI * 4 * (ulong)in_EDX);
  *(undefined1 *)(in_RDI + 0x5c) = 1;
  if (*(long *)(in_RDI + 0x40) == 0) {
    if (*(long *)(in_RDI + 0x48) != 0) {
      for (local_19 = 0; local_19 < *(byte *)(**(long **)(in_RDI + 0x48) + 0xb);
          local_19 = local_19 + 1) {
        if (*(long *)(*(long *)(*(long *)(in_RDI + 0x48) + 8) + (ulong)local_19 * 0x68 + 0x28) != 0)
        {
          FACTWave_SetMatrixCoefficients
                    (*(FACTWave **)
                      (*(long *)(*(long *)(in_RDI + 0x48) + 8) + (ulong)local_19 * 0x68 + 0x28),
                     in_ESI,in_EDX,in_RCX);
        }
      }
    }
  }
  else {
    FACTWave_SetMatrixCoefficients(*(FACTWave **)(in_RDI + 0x40),in_ESI,in_EDX,in_RCX);
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x116b57);
  return 0;
}

Assistant:

uint32_t FACTCue_SetMatrixCoefficients(
	FACTCue *pCue,
	uint32_t uSrcChannelCount,
	uint32_t uDstChannelCount,
	float *pMatrixCoefficients
) {
	uint8_t i;

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	/* See FACTCue.matrixCoefficients declaration */
	FAudio_assert(uSrcChannelCount > 0 && uSrcChannelCount < 3);
	FAudio_assert(uDstChannelCount > 0 && uDstChannelCount < 9);

	/* Local storage */
	pCue->srcChannels = uSrcChannelCount;
	pCue->dstChannels = uDstChannelCount;
	FAudio_memcpy(
		pCue->matrixCoefficients,
		pMatrixCoefficients,
		sizeof(float) * uSrcChannelCount * uDstChannelCount
	);
	pCue->active3D = 1;

	/* Apply to Waves if they exist */
	if (pCue->simpleWave != NULL)
	{
		FACTWave_SetMatrixCoefficients(
			pCue->simpleWave,
			uSrcChannelCount,
			uDstChannelCount,
			pMatrixCoefficients
		);
	}
	else if (pCue->playingSound != NULL)
	{
		for (i = 0; i < pCue->playingSound->sound->trackCount; i += 1)
		{
			if (pCue->playingSound->tracks[i].activeWave.wave != NULL)
			{
				FACTWave_SetMatrixCoefficients(
					pCue->playingSound->tracks[i].activeWave.wave,
					uSrcChannelCount,
					uDstChannelCount,
					pMatrixCoefficients
				);
			}
		}
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}